

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

void * bsp_create(int dimensions)

{
  bsp_tree *root;
  float **ppfVar1;
  float *pfVar2;
  void **ppvVar3;
  bsp_node *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  root = (bsp_tree *)malloc(0x18);
  root->dimensions = (uint8_t)dimensions;
  root->maxdepth = '@';
  root->maxnodepoints = 0x40;
  root->flags = 0;
  root->mempoolid = 0;
  ppfVar1 = (float **)malloc((long)dimensions * 8 + 8);
  root->pointarrays = ppfVar1;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < dimensions) {
    uVar6 = (ulong)(uint)dimensions;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pfVar2 = array_create_float(0x20);
    ppfVar1[uVar5] = pfVar2;
  }
  ppvVar3 = array_create_ptr(0x20);
  ppfVar1[(ulong)(uint)dimensions & 0xff] = (float *)ppvVar3;
  pbVar4 = _bsp_create_node(root);
  root->top = pbVar4;
  return root;
}

Assistant:

void *
bsp_create(
    int dimensions )
{
    bsp_tree * tree;
    int i;

    assert( dimensions > 0 && dimensions < 128 );

    tree = (bsp_tree *)malloc( sizeof( bsp_tree ) );
    assert( tree != NULL );

    tree->dimensions = dimensions;
    tree->flags = 0;
    tree->maxdepth = 64;
    tree->maxnodepoints = 64;
    tree->mempoolid = 0;

    tree->pointarrays = (float **)malloc( sizeof(float *) * (dimensions + 1) );
    assert( tree->pointarrays != NULL );

    for ( i = 0; i < dimensions; i++ ) {
        tree->pointarrays[i] = array_create_float( 32 );
        assert( tree->pointarrays[i] != NULL );
    }
    tree->pointarrays[tree->dimensions] = (float *) array_create_ptr( 32 );
    assert( tree->pointarrays[tree->dimensions] != NULL );

    tree->top = _bsp_create_node( tree );
    return (void *) tree;
}